

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_timings.c
# Opt level: O3

void dump_regs(int cnum,FILE *outf,uint32_t *ref_val,int ref_exist,uint32_t reg,uint32_t regs_len,
              color color)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  char *pcVar4;
  int i;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  bool bVar8;
  uint32_t local_64;
  int local_60;
  uint32_t local_5c;
  uint local_58;
  uint32_t local_54;
  uint32_t *local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  if (regs_len != 0) {
    local_40 = (ulong)reg;
    local_48 = (ulong)regs_len;
    local_38 = (long)cnum << 5;
    uVar7 = 0;
    local_60 = ref_exist;
    local_50 = ref_val;
    do {
      uVar1 = uVar7 + local_40;
      local_58 = (uint)uVar7 & 0xc;
      if ((uVar7 & 0xc) == 0) {
        fprintf((FILE *)outf,"%08x: ",uVar1 & 0xffffffff);
      }
      local_5c = *(uint32_t *)(*(long *)((long)&nva_cards->bar0 + local_38) + uVar1);
      local_54 = local_50[uVar7];
      local_64 = local_5c;
      lVar5 = 3;
      do {
        if (color == NO_COLOR) {
          bVar2 = *(byte *)((long)&local_64 + lVar5);
LAB_00103b75:
          pcVar4 = "";
          pcVar6 = "";
          bVar3 = bVar2;
        }
        else {
          bVar2 = *(byte *)((long)&local_54 + lVar5);
          pcVar4 = "\x1b[0;31m";
          pcVar6 = "\x1b[0m";
          bVar3 = *(byte *)((long)&local_64 + lVar5);
          if (bVar2 == *(byte *)((long)&local_64 + lVar5)) goto LAB_00103b75;
        }
        fprintf((FILE *)outf,"%s%02x%s",pcVar4,(ulong)bVar3,pcVar6);
        bVar8 = lVar5 != 0;
        lVar5 = lVar5 + -1;
      } while (bVar8);
      fputc(0x20,(FILE *)outf);
      if (local_60 == 0) {
        local_50[uVar7] = local_5c;
      }
      if (local_58 == 0xc) {
        fputc(10,(FILE *)outf);
      }
      uVar7 = uVar7 + 4;
    } while (uVar7 < local_48);
  }
  return;
}

Assistant:

static void
dump_regs(int cnum, FILE* outf, uint32_t ref_val[], int ref_exist, uint32_t reg, uint32_t regs_len, enum color color)
{
	uint32_t val;
	int r;

	for (r = 0; r < regs_len; r+=4)
        {
                if (r % 0x10 == 0)
                        fprintf(outf, "%08x: ", reg + r);

                val = nva_rd32(cnum, reg + r);

                print_reg_diff(outf, ref_val[r], val, color);

                /* if the value wasn't initialized before, store it as a reference */
                if (ref_exist == 0)
                        ref_val[r] = val;

                if (r % 0x10 == 0xc)
                        fprintf(outf, "\n");
        }
}